

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_color_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::VolumeMeshColorQuantity::VolumeMeshColorQuantity
          (VolumeMeshColorQuantity *this,string *name,VolumeMesh *mesh_,string *definedOn_,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *colorValues_)

{
  string sStack_48;
  
  std::__cxx11::string::string((string *)&sStack_48,(string *)name);
  VolumeMeshQuantity::VolumeMeshQuantity(&this->super_VolumeMeshQuantity,&sStack_48,mesh_,true);
  std::__cxx11::string::~string((string *)&sStack_48);
  (this->super_VolumeMeshQuantity).super_QuantityS<polyscope::VolumeMesh>.super_Quantity.
  _vptr_Quantity = (_func_int **)&PTR__VolumeMeshColorQuantity_005989a8;
  ColorQuantity<polyscope::VolumeMeshColorQuantity>::ColorQuantity
            (&this->super_ColorQuantity<polyscope::VolumeMeshColorQuantity>,this,colorValues_);
  (this->super_VolumeMeshQuantity).super_QuantityS<polyscope::VolumeMesh>.super_Quantity.
  _vptr_Quantity = (_func_int **)&PTR__VolumeMeshColorQuantity_005989a8;
  std::__cxx11::string::string((string *)&this->definedOn,(string *)definedOn_);
  (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->sliceProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->sliceProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

VolumeMeshColorQuantity::VolumeMeshColorQuantity(std::string name, VolumeMesh& mesh_, std::string definedOn_,
                                                 const std::vector<glm::vec3>& colorValues_)
    : VolumeMeshQuantity(name, mesh_, true), ColorQuantity(*this, colorValues_), definedOn(definedOn_) {}